

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O0

void __thiscall TestMustache::testSections(TestMustache *this)

{
  bool bVar1;
  QVariant *pQVar2;
  QString local_3b8;
  QVariant local_3a0;
  QtVariantContext local_380;
  QString local_358;
  QHash<QString,_QVariant> local_340;
  QVariant local_338;
  QString local_318;
  QVariant local_300;
  QtVariantContext local_2e0;
  QString local_2b8;
  undefined4 local_29c;
  undefined1 local_298 [8];
  QString output;
  undefined1 local_260 [8];
  QtVariantContext context;
  Renderer renderer;
  QString expectedOutput;
  QString _template;
  QVariant local_140;
  QString local_120;
  QString local_108;
  undefined1 local_f0 [40];
  QString local_c8;
  QString local_b0;
  undefined1 local_98 [40];
  undefined1 local_70 [8];
  QVariantList contacts;
  QString local_48;
  QString local_30;
  QVariantHash map;
  TestMustache *this_local;
  
  map.d = (Data *)this;
  QString::QString(&local_30,"John Smith");
  QString::QString(&local_48,"john.smith@gmail.com");
  contactInfo((QString *)&stack0xffffffffffffffe8,&local_30);
  QString::~QString(&local_48);
  QString::~QString(&local_30);
  QList<QVariant>::QList((QList<QVariant> *)local_70);
  QString::QString(&local_b0,"James Dee");
  QString::QString(&local_c8,"james@dee.org");
  contactInfo((QString *)local_98,&local_b0);
  ::QVariant::QVariant((QVariant *)(local_98 + 8),(QHash_conflict *)local_98);
  QList<QVariant>::operator<<((QList<QVariant> *)local_70,(rvalue_ref)(local_98 + 8));
  ::QVariant::~QVariant((QVariant *)(local_98 + 8));
  QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)local_98);
  QString::~QString(&local_c8);
  QString::~QString(&local_b0);
  QString::QString(&local_108,"Jim Jones");
  QString::QString(&local_120,"jim-jones@yahoo.com");
  contactInfo((QString *)local_f0,&local_108);
  ::QVariant::QVariant((QVariant *)(local_f0 + 8),(QHash_conflict *)local_f0);
  QList<QVariant>::operator<<((QList<QVariant> *)local_70,(rvalue_ref)(local_f0 + 8));
  ::QVariant::~QVariant((QVariant *)(local_f0 + 8));
  QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)local_f0);
  QString::~QString(&local_120);
  QString::~QString(&local_108);
  ::QVariant::QVariant(&local_140,(QList_conflict1 *)local_70);
  QString::QString((QString *)&_template.d.size,"contacts");
  pQVar2 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)&stack0xffffffffffffffe8,
                      (QString *)&_template.d.size);
  ::QVariant::operator=(pQVar2,&local_140);
  QString::~QString((QString *)&_template.d.size);
  ::QVariant::~QVariant(&local_140);
  QString::QString((QString *)&expectedOutput.d.size,
                   "Name: {{name}}, Email: {{email}}\n{{#contacts}}  {{name}} - {{email}}\n{{/contacts}}{{^contacts}}  No contacts{{/contacts}}"
                  );
  QString::QString((QString *)&renderer.m_defaultTagEndMarker.d.size,
                   "Name: John Smith, Email: john.smith@gmail.com\n  James Dee - james@dee.org\n  Jim Jones - jim-jones@yahoo.com\n"
                  );
  Mustache::Renderer::Renderer((Renderer *)&context.m_contextStack.super_QList<QVariant>.d.size);
  ::QVariant::QVariant((QVariant *)&output.d.size,(QHash_conflict *)&stack0xffffffffffffffe8);
  Mustache::QtVariantContext::QtVariantContext
            ((QtVariantContext *)local_260,(QVariant *)&output.d.size,(PartialResolver *)0x0);
  ::QVariant::~QVariant((QVariant *)&output.d.size);
  Mustache::Renderer::render
            ((QString *)local_298,(Renderer *)&context.m_contextStack.super_QList<QVariant>.d.size,
             (QString *)&expectedOutput.d.size,(Context *)local_260);
  bVar1 = QTest::qCompare((QString *)local_298,(QString *)&renderer.m_defaultTagEndMarker.d.size,
                          "output","expectedOutput",
                          "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                          ,0x68);
  if (bVar1) {
    QString::QString(&local_2b8,"contacts");
    QHash<QString,_QVariant>::remove
              ((QHash<QString,_QVariant> *)&stack0xffffffffffffffe8,(char *)&local_2b8);
    QString::~QString(&local_2b8);
    ::QVariant::QVariant(&local_300,(QHash_conflict *)&stack0xffffffffffffffe8);
    Mustache::QtVariantContext::QtVariantContext(&local_2e0,&local_300,(PartialResolver *)0x0);
    Mustache::QtVariantContext::operator=((QtVariantContext *)local_260,&local_2e0);
    Mustache::QtVariantContext::~QtVariantContext(&local_2e0);
    ::QVariant::~QVariant(&local_300);
    Mustache::Renderer::render
              (&local_318,(Renderer *)&context.m_contextStack.super_QList<QVariant>.d.size,
               (QString *)&expectedOutput.d.size,(Context *)local_260);
    QString::operator=((QString *)local_298,&local_318);
    QString::~QString(&local_318);
    QString::operator=((QString *)&renderer.m_defaultTagEndMarker.d.size,
                       "Name: John Smith, Email: john.smith@gmail.com\n  No contacts");
    bVar1 = QTest::qCompare((QString *)local_298,(QString *)&renderer.m_defaultTagEndMarker.d.size,
                            "output","expectedOutput",
                            "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                            ,0x71);
    if (bVar1) {
      local_340.d = (Data *)0x0;
      QHash<QString,_QVariant>::QHash(&local_340);
      ::QVariant::QVariant(&local_338,(QHash_conflict *)&local_340);
      QString::QString(&local_358,"contacts");
      pQVar2 = QHash<QString,_QVariant>::operator[]
                         ((QHash<QString,_QVariant> *)&stack0xffffffffffffffe8,&local_358);
      ::QVariant::operator=(pQVar2,&local_338);
      QString::~QString(&local_358);
      ::QVariant::~QVariant(&local_338);
      QHash<QString,_QVariant>::~QHash(&local_340);
      ::QVariant::QVariant(&local_3a0,(QHash_conflict *)&stack0xffffffffffffffe8);
      Mustache::QtVariantContext::QtVariantContext(&local_380,&local_3a0,(PartialResolver *)0x0);
      Mustache::QtVariantContext::operator=((QtVariantContext *)local_260,&local_380);
      Mustache::QtVariantContext::~QtVariantContext(&local_380);
      ::QVariant::~QVariant(&local_3a0);
      Mustache::Renderer::render
                (&local_3b8,(Renderer *)&context.m_contextStack.super_QList<QVariant>.d.size,
                 (QString *)&expectedOutput.d.size,(Context *)local_260);
      QString::operator=((QString *)local_298,&local_3b8);
      QString::~QString(&local_3b8);
      bVar1 = QTest::qCompare((QString *)local_298,(QString *)&renderer.m_defaultTagEndMarker.d.size
                              ,"output","expectedOutput",
                              "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                              ,0x77);
      if (bVar1) {
        local_29c = 0;
      }
      else {
        local_29c = 1;
      }
    }
    else {
      local_29c = 1;
    }
  }
  else {
    local_29c = 1;
  }
  QString::~QString((QString *)local_298);
  Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)local_260);
  Mustache::Renderer::~Renderer((Renderer *)&context.m_contextStack.super_QList<QVariant>.d.size);
  QString::~QString((QString *)&renderer.m_defaultTagEndMarker.d.size);
  QString::~QString((QString *)&expectedOutput.d.size);
  QList<QVariant>::~QList((QList<QVariant> *)local_70);
  QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void TestMustache::testSections()
{
	QVariantHash map = contactInfo("John Smith", "john.smith@gmail.com");
	QVariantList contacts;
	contacts << contactInfo("James Dee", "james@dee.org");
	contacts << contactInfo("Jim Jones", "jim-jones@yahoo.com");
	map["contacts"] = contacts;

	QString _template = "Name: {{name}}, Email: {{email}}\n"
	                    "{{#contacts}}  {{name}} - {{email}}\n{{/contacts}}"
	                    "{{^contacts}}  No contacts{{/contacts}}";

	QString expectedOutput = "Name: John Smith, Email: john.smith@gmail.com\n"
	                         "  James Dee - james@dee.org\n"
	                         "  Jim Jones - jim-jones@yahoo.com\n";

	Mustache::Renderer renderer;
	Mustache::QtVariantContext context(map);
	QString output = renderer.render(_template, &context);

	QCOMPARE(output, expectedOutput);

	// test inverted sections
	map.remove("contacts");
	context = Mustache::QtVariantContext(map);
	output = renderer.render(_template, &context);

	expectedOutput = "Name: John Smith, Email: john.smith@gmail.com\n"
	                 "  No contacts";
	QCOMPARE(output, expectedOutput);

	// test with an empty list instead of an empty key
	map["contacts"] = QVariantHash();
	context = Mustache::QtVariantContext(map);
	output = renderer.render(_template, &context);
	QCOMPARE(output, expectedOutput);
}